

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ObjectivePropagation::recomputeCapacityThreshold(ObjectivePropagation *this)

{
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *pvVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  HighsObjectiveFunction *pHVar5;
  pointer ppVar6;
  pointer pOVar7;
  pointer piVar8;
  pointer piVar9;
  LinkType LVar10;
  HighsDomain *pHVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ObjectiveContributionTree contributionTree;
  RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_48;
  int *local_40;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_38;
  
  pHVar11 = this->domain;
  pHVar5 = this->objFunc;
  uVar13 = (int)((ulong)((long)(pHVar5->cliquePartitionStart).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pHVar5->cliquePartitionStart).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2) - 1;
  dVar16 = -((pHVar11->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  this->capacityThreshold = dVar16;
  lVar14 = 0;
  uVar12 = 0;
  if (0 < (int)uVar13) {
    uVar12 = (ulong)uVar13;
  }
  pvVar1 = &this->objectiveLowerContributions;
  for (; uVar12 * 8 != lVar14; lVar14 = lVar14 + 8) {
    ppVar6 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40 = (int *)((long)&ppVar6->second + lVar14);
    local_48.rootNode = (LinkType *)((long)&ppVar6->first + lVar14);
    iVar3 = *local_40;
    lVar15 = (long)iVar3;
    if (lVar15 != -1) {
      pOVar7 = (pvVar1->
               super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar4 = pOVar7[lVar15].col;
      dVar18 = (pHVar11->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar4];
      pdVar2 = (pHVar11->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      if ((dVar18 != *pdVar2) || (NAN(dVar18) || NAN(*pdVar2))) {
        dVar16 = pOVar7[lVar15].contribution;
        local_38 = pvVar1;
        LVar10 = ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::last
                           (&local_48);
        if (LVar10 != iVar3) {
          dVar16 = dVar16 - (pvVar1->
                            super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                            )._M_impl.super__Vector_impl_data._M_start[LVar10].contribution;
        }
        pHVar11 = this->domain;
        dVar16 = (1.0 - ((pHVar11->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
                 * dVar16;
        if (dVar16 <= this->capacityThreshold) {
          dVar16 = this->capacityThreshold;
        }
        this->capacityThreshold = dVar16;
      }
    }
  }
  piVar8 = (this->objFunc->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (this->objFunc->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar14 = (long)(pHVar5->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)uVar13];
      lVar14 < (int)((ulong)((long)piVar9 - (long)piVar8) >> 2); lVar14 = lVar14 + 1) {
    iVar3 = piVar8[lVar14];
    dVar18 = ((pHVar11->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar17 = (pHVar11->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3] -
             (pHVar11->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3];
    if ((pHVar11->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3] == kContinuous) {
      dVar19 = dVar17 * 0.3;
      dVar18 = dVar18 * 1000.0;
      if (dVar18 <= dVar19) {
        dVar18 = dVar19;
      }
    }
    dVar18 = (dVar17 - dVar18) * ABS(this->cost[iVar3]);
    if (dVar18 <= dVar16) {
      dVar18 = dVar16;
    }
    dVar16 = dVar18;
    this->capacityThreshold = dVar16;
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::recomputeCapacityThreshold() {
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();
  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  capacityThreshold = -domain->feastol();
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    HighsInt worstPos = contributionTree.first();
    if (worstPos == -1) continue;
    if (domain->isFixed(objectiveLowerContributions[worstPos].col)) continue;

    double contribution = objectiveLowerContributions[worstPos].contribution;
    HighsInt bestPos = contributionTree.last();
    if (bestPos != worstPos)
      contribution -= objectiveLowerContributions[bestPos].contribution;

    capacityThreshold =
        std::max(capacityThreshold, contribution * (1.0 - domain->feastol()));
  }

  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const HighsInt numObjNzs = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNzs; ++i) {
    HighsInt col = objNonzeros[i];

    capacityThreshold = std::max(
        capacityThreshold,
        std::fabs(cost[col]) *
            boundRange(domain->col_upper_[col], domain->col_lower_[col],
                       domain->feastol(), domain->variableType(col)));
  }
}